

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_action.cpp
# Opt level: O1

void A_Unblock(AActor *self,bool drop)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  PClass *pPVar3;
  DDropItem *pDVar4;
  PClass *pPVar5;
  PClassActor *pPVar6;
  bool bVar7;
  FName local_1c;
  
  uVar1 = (self->flags).Value;
  if ((uVar1 >> 0x1e & 1) != 0) {
    self->Alpha = 1.0;
    self->visdir = '\0';
  }
  (self->flags).Value = uVar1 & 0xfffffffd;
  if ((self->Conversation == (FStrifeDialogueNode *)0x0) ||
     (pPVar6 = self->Conversation->DropType, pPVar6 == (PClassActor *)0x0)) {
    self->Conversation = (FStrifeDialogueNode *)0x0;
    pPVar5 = APlayerPawn::RegistrationInfo.MyClass;
    if (drop) {
      if ((self->super_DThinker).super_DObject.Class == (PClass *)0x0) {
        iVar2 = (**(self->super_DThinker).super_DObject._vptr_DObject)(self);
        (self->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar2);
      }
      pPVar3 = (self->super_DThinker).super_DObject.Class;
      bVar7 = pPVar3 != (PClass *)0x0;
      if (pPVar3 != pPVar5 && bVar7) {
        do {
          pPVar3 = pPVar3->ParentClass;
          bVar7 = pPVar3 != (PClass *)0x0;
          if (pPVar3 == pPVar5) break;
        } while (pPVar3 != (PClass *)0x0);
      }
      if (!bVar7) {
        pDVar4 = AActor::GetDropItems(self);
        if (pDVar4 != (DDropItem *)0x0) {
          do {
            local_1c.Index = (pDVar4->Name).Index;
            if (local_1c.Index != 0) {
              pPVar5 = PClass::FindClass(&local_1c);
              pPVar6 = dyn_cast<PClassActor>((DObject *)pPVar5);
              if (pPVar6 != (PClassActor *)0x0) {
                P_DropItem(self,pPVar6,pDVar4->Amount,pDVar4->Probability);
              }
            }
            pDVar4 = pDVar4->Next;
          } while (pDVar4 != (DDropItem *)0x0);
        }
      }
    }
  }
  else {
    P_DropItem(self,pPVar6,-1,0x100);
    self->Conversation = (FStrifeDialogueNode *)0x0;
  }
  return;
}

Assistant:

void A_Unblock(AActor *self, bool drop)
{
	// [RH] Andy Baker's stealth monsters
	if (self->flags & MF_STEALTH)
	{
		self->Alpha = 1.;
		self->visdir = 0;
	}

	self->flags &= ~MF_SOLID;

	// If the actor has a conversation that sets an item to drop, drop that.
	if (self->Conversation != NULL && self->Conversation->DropType != NULL)
	{
		P_DropItem (self, self->Conversation->DropType, -1, 256);
		self->Conversation = NULL;
		return;
	}

	self->Conversation = NULL;

	// If the actor has attached metadata for items to drop, drop those.
	if (drop && !self->IsKindOf (RUNTIME_CLASS (APlayerPawn)))	// [GRB]
	{
		DDropItem *di = self->GetDropItems();

		if (di != NULL)
		{
			while (di != NULL)
			{
				if (di->Name != NAME_None)
				{
					PClassActor *ti = PClass::FindActor(di->Name);
					if (ti != NULL)
					{
						P_DropItem (self, ti, di->Amount, di->Probability);
					}
				}
				di = di->Next;
			}
		}
	}
}